

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O2

void __thiscall
CompressedArray::CompressedArray
          (CompressedArray *this,vector<Record,_std::allocator<Record>_> *sorted_records)

{
  vector<bool,_std::allocator<bool>_> *__x;
  uint uVar1;
  _Bit_type *p_Var2;
  _Bit_type *p_Var3;
  _Bit_pointer puVar4;
  Key KVar5;
  pointer pBVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Bvector_impl *p_Var9;
  uint32_t record_index;
  BlockHeader header;
  pointer local_88;
  _Vector_base<Record,_std::allocator<Record>_> local_70;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_dump_00145d18;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  __x = &this->data;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ngram_count_values).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_dump_00144e08;
  (this->ngram_count_values).words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ngram_count_values).words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ngram_count_values).words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->continuations_count_values).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_dump_00144e08;
  (this->continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->unique_continuations_count_values).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_dump_00144e08;
  (this->unique_continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->unique_continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->unique_continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Record,_std::allocator<Record>_>::vector
            ((vector<Record,_std::allocator<Record>_> *)&local_70,sorted_records);
  store_values(this,(vector<Record,_std::allocator<Record>_> *)&local_70);
  std::_Vector_base<Record,_std::allocator<Record>_>::~_Vector_base(&local_70);
  this->record_count =
       (uint32_t)
       (((long)(sorted_records->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(sorted_records->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
              super__Vector_impl_data._M_start) / 0x14);
  find_best_radix_parameters(this,sorted_records);
  record_index = 0;
  do {
    if (this->record_count <= record_index) {
      std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
      vector((vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_> *)
             &header,&this->headers);
      KVar5 = (Key)(this->headers).
                   super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      pBVar6 = (this->headers).
               super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->headers).
      super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)header.key;
      (this->headers).
      super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)header._8_8_;
      (this->headers).
      super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_88;
      header.key = KVar5;
      header._8_8_ = pBVar6;
      std::_Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
      ::~_Vector_base((_Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                       *)&header);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_58,__x);
      header.key = (Key)local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                        _M_p;
      header.record_index =
           local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
      header.offset =
           local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_;
      puVar4 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_end_of_storage;
      p_Var2 = (__x->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p;
      p_Var9 = &(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl;
      uVar7._0_4_ = (p_Var9->super__Bvector_impl_data)._M_start.super__Bit_iterator_base._M_offset;
      uVar7._4_4_ = *(undefined4 *)
                     &(p_Var9->super__Bvector_impl_data)._M_start.super__Bit_iterator_base.field_0xc
      ;
      p_Var3 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      p_Var9 = &(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl;
      uVar8._0_4_ = (p_Var9->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
      uVar8._4_4_ = *(undefined4 *)
                     &(p_Var9->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.
                      field_0xc;
      (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = local_58._M_impl.super__Bvector_impl_data._M_end_of_storage;
      (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p =
           local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      p_Var9 = &(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl;
      (p_Var9->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset =
           local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      *(undefined4 *)
       &(p_Var9->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc =
           local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_;
      (__x->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      p_Var9 = &(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl;
      (p_Var9->super__Bvector_impl_data)._M_start.super__Bit_iterator_base._M_offset =
           local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
      *(undefined4 *)&(p_Var9->super__Bvector_impl_data)._M_start.super__Bit_iterator_base.field_0xc
           = local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_;
      local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = p_Var2;
      local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = uVar7;
      local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var3;
      local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ = uVar8;
      local_58._M_impl.super__Bvector_impl_data._M_end_of_storage = puVar4;
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
      return;
    }
    header.key = (sorted_records->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
                 super__Vector_impl_data._M_start[record_index].key;
    header.offset =
         (*(int *)&(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
         *(int *)&(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
         (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    header.record_index = record_index;
    std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::
    push_back(&this->headers,&header);
    p_Var2 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    p_Var3 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar1 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_finish.super__Bit_iterator_base._M_offset;
    record_index = fill_block(this,sorted_records,record_index);
  } while (((ulong)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset -
           (ulong)uVar1) +
           ((long)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p +
           ((long)p_Var2 -
           ((long)p_Var3 +
           (long)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p))) * 8 < 0x401);
  __assert_fail("new_size - old_size <= max_block_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/src/CompressedArray.cpp"
                ,0x1b,"CompressedArray::CompressedArray(vector<Record>)");
}

Assistant:

CompressedArray::CompressedArray(vector<Record> sorted_records) {
    store_values(sorted_records);
    record_count = uint32_t(sorted_records.size());
    find_best_radix_parameters(sorted_records);

    uint32_t record_index = 0;
    while (record_index < record_count) {
        BlockHeader header;
        header.key = sorted_records[record_index].key;
        header.record_index = record_index;
        header.offset = uint32_t(data.size());
        headers.push_back(header);

        size_t old_size = data.size();
        record_index = fill_block(sorted_records, record_index);
        size_t new_size = data.size();
        assert(new_size - old_size <= max_block_size);
    }
    vector<BlockHeader>(headers).swap(headers);
    vector<bool>(data).swap(data);
}